

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalcrules.cpp
# Opt level: O0

void __thiscall fmcalc::init_profile__stepped_rec(fmcalc *this,fm_profile_step *f)

{
  size_type sVar1;
  reference this_00;
  undefined1 local_38 [8];
  profile_rec_new p;
  fm_profile_step *f_local;
  fmcalc *this_local;
  
  p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)f;
  profile_rec_new::profile_rec_new((profile_rec_new *)local_38);
  local_38._0_4_ =
       *(undefined4 *)
        &(p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage)->tc_id;
  local_38._4_4_ =
       p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage[5].tc_val;
  switch(local_38._0_4_) {
  case 2:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x06',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[3].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x03',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[2].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  default:
    fprintf(_stderr,"FATAL: Invalid calc rule for stepped policies\n");
    exit(1);
  case 0xc:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0xe:
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x1b:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x05',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[7].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\v',*(OASIS_FLOAT *)
                 &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[6].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\r',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[8].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x0e',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[8].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\t',*(OASIS_FLOAT *)
                 &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[5].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\n',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[6].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x1c:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x05',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[7].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\v',*(OASIS_FLOAT *)
                 &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[6].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\r',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[8].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x0e',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[8].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\t',*(OASIS_FLOAT *)
                 &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[5].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\n',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[6].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x1d:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x05',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[7].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\v',*(OASIS_FLOAT *)
                 &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[6].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\r',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[8].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x0e',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[8].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\t',*(OASIS_FLOAT *)
                 &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[5].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\n',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[6].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x1e:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x05',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[7].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\v',*(OASIS_FLOAT *)
                 &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[6].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\r',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[8].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x0e',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[8].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\t',*(OASIS_FLOAT *)
                 &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[5].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\n',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[6].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x1f:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x05',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[7].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\v',*(OASIS_FLOAT *)
                 &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[6].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\r',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[8].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x0e',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[8].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\t',*(OASIS_FLOAT *)
                 &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[5].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\n',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[6].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x20:
    add_tc('\v',*(OASIS_FLOAT *)
                 &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[6].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\r',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[8].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\t',*(OASIS_FLOAT *)
                 &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[5].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x05',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[7].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x0e',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[8].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x22:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x06',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[3].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x03',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[2].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x25:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x05',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[7].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\v',*(OASIS_FLOAT *)
                 &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[6].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\r',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[8].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x0e',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[8].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\t',*(OASIS_FLOAT *)
                 &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[5].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\n',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[6].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
  case 0x26:
    add_tc('\x05',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[7].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\r',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[8].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x0e',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[8].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\t',*(OASIS_FLOAT *)
                 &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[5].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\n',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[6].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 100:
  }
  sVar1 = std::
          vector<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>,_std::allocator<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>_>
          ::size(&this->profile_vec_stepped_);
  if (sVar1 < (long)(int)(p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage)->tc_val + 1U) {
    std::
    vector<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>,_std::allocator<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>_>
    ::resize(&this->profile_vec_stepped_,
             (long)(int)(p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage)->tc_val + 1);
  }
  this_00 = std::
            vector<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>,_std::allocator<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>_>
            ::operator[](&this->profile_vec_stepped_,
                         (long)(int)(p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage)->tc_val);
  std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>::push_back
            (this_00,(value_type *)local_38);
  profile_rec_new::~profile_rec_new((profile_rec_new *)local_38);
  return;
}

Assistant:

void fmcalc::init_profile__stepped_rec(fm_profile_step& f)
{
	profile_rec_new p;
	p.calcrule_id = f.calcrule_id;
	p.step_id = f.step_id;
	switch (p.calcrule_id) {
		case 2:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit1, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(attachment_1, f.attachment, p.tc_vec);
			break;
		case 12:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			break;
		case 14:
			add_tc(limit_1, f.limit1, p.tc_vec);
			break;
		case 27:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_2, f.limit2, p.tc_vec);
			add_tc(limit_1, f.limit1, p.tc_vec);
			add_tc(payout_start, f.payout_start, p.tc_vec);
			add_tc(scale_1, f.scale1, p.tc_vec);
			add_tc(scale_2, f.scale2, p.tc_vec);
			add_tc(trigger_start, f.trigger_start, p.tc_vec);
			add_tc(trigger_end, f.trigger_end, p.tc_vec);
			break;
		case 28:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_2, f.limit2, p.tc_vec);
			add_tc(payout_start, f.payout_start, p.tc_vec);
			add_tc(scale_1, f.scale1, p.tc_vec);
			add_tc(scale_2, f.scale2, p.tc_vec);
			add_tc(trigger_start, f.trigger_start, p.tc_vec);
			add_tc(trigger_end, f.trigger_end, p.tc_vec);
			break;
		case 29:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_2, f.limit2, p.tc_vec);
			add_tc(payout_start, f.payout_start, p.tc_vec);
			add_tc(scale_1, f.scale1, p.tc_vec);
			add_tc(scale_2, f.scale2, p.tc_vec);
			add_tc(trigger_start, f.trigger_start, p.tc_vec);
			add_tc(trigger_end, f.trigger_end, p.tc_vec);
			break;
		case 30:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_2, f.limit2, p.tc_vec);
			add_tc(limit_1, f.limit1, p.tc_vec);
			add_tc(payout_start, f.payout_start, p.tc_vec);
			add_tc(scale_1, f.scale1, p.tc_vec);
			add_tc(scale_2, f.scale2, p.tc_vec);
			add_tc(trigger_start, f.trigger_start, p.tc_vec);
			add_tc(trigger_end, f.trigger_end, p.tc_vec);
			break;
		case 31:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_2, f.limit2, p.tc_vec);
			add_tc(payout_start, f.payout_start, p.tc_vec);
			add_tc(scale_1, f.scale1, p.tc_vec);
			add_tc(scale_2, f.scale2, p.tc_vec);
			add_tc(trigger_start, f.trigger_start, p.tc_vec);
			add_tc(trigger_end, f.trigger_end, p.tc_vec);
			break;
		case 32:
			add_tc(payout_start, f.payout_start, p.tc_vec);
			add_tc(scale_1, f.scale1, p.tc_vec);
			add_tc(trigger_start, f.trigger_start, p.tc_vec);
			add_tc(limit_1, f.limit1, p.tc_vec);
			add_tc(limit_2, f.limit2, p.tc_vec);
			add_tc(scale_2, f.scale2, p.tc_vec);
			break;
		case 34:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(attachment_1, f.attachment, p.tc_vec);
			break;
		case 37:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_2, f.limit2, p.tc_vec);
			add_tc(limit_1, f.limit1, p.tc_vec);
			add_tc(payout_start, f.payout_start, p.tc_vec);
			add_tc(scale_1, f.scale1, p.tc_vec);
			add_tc(scale_2, f.scale2, p.tc_vec);
			add_tc(trigger_start, f.trigger_start, p.tc_vec);
			add_tc(trigger_end, f.trigger_end, p.tc_vec);
		case 38:
			add_tc(limit_2, f.limit2, p.tc_vec);
			add_tc(scale_1, f.scale1, p.tc_vec);
			add_tc(scale_2, f.scale2, p.tc_vec);
			add_tc(trigger_start, f.trigger_start, p.tc_vec);
			add_tc(trigger_end, f.trigger_end, p.tc_vec);
			break;
		case 100:
			break;
		default:
		{
			fprintf(stderr, "FATAL: Invalid calc rule for stepped policies\n");
			exit(EXIT_FAILURE);
		}
	}
	if (profile_vec_stepped_.size() < ((size_t) f.profile_id) + 1 ) {
		profile_vec_stepped_.resize((size_t) f.profile_id + 1);
	}
	profile_vec_stepped_[f.profile_id].push_back(p);
}